

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

void vectorwrite32le<std::shared_ptr<ReadWriter>>(shared_ptr<ReadWriter> *wr,DwordVector *v)

{
  bool bVar1;
  element_type *this;
  reference puVar2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  const_iterator i;
  DwordVector *v_local;
  shared_ptr<ReadWriter> *wr_local;
  
  i._M_current = (uint *)v;
  local_20._M_current = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(v);
  while( true ) {
    local_28._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(i._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      wr);
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_20);
    ReadWriter::write32le(this,*puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void vectorwrite32le(PTR wr, const DwordVector& v)
    {
        for (DwordVector::const_iterator i= v.begin() ; i!=v.end() ; ++i)
            wr->write32le(*i);
    }